

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invent.c
# Opt level: O1

int look_here(int obj_cnt,boolean picked_some)

{
  monst *mon;
  boolean bVar1;
  boolean bVar2;
  int iVar3;
  char *pcVar4;
  trap *ptVar5;
  size_t sVar6;
  char *pcVar7;
  char *pcVar8;
  int iVar9;
  undefined7 in_register_00000031;
  obj *poVar10;
  char *pcVar11;
  bool bVar12;
  int size;
  nh_objitem *items;
  char *local_258;
  undefined4 local_24c;
  obj *local_248;
  char *local_240;
  char fbuf [256];
  char fbuf2 [256];
  
  iVar9 = iflags.pilesize;
  local_24c = (undefined4)CONCAT71(in_register_00000031,picked_some);
  if ((u.uprops[0x1e].intrinsic == 0) &&
     (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
      (((youmonst.data)->mflags1 & 0x1000) == 0)))) {
    pcVar11 = "see";
  }
  else if (ublindf == (obj *)0x0) {
    pcVar11 = "feel";
  }
  else {
    pcVar11 = "feel";
    if (ublindf->oartifact == '\x1d') {
      pcVar11 = "see";
    }
  }
  size = 10;
  items = (nh_objitem *)0x0;
  if (((u.uprops[0x1e].intrinsic == 0) && ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)))) &&
     (((youmonst.data)->mflags1 & 0x1000) == 0)) {
    pcVar8 = "Things that are here:";
  }
  else if (ublindf == (obj *)0x0) {
    pcVar8 = "Things that you feel here:";
  }
  else {
    pcVar8 = "Things that you feel here:";
    if (ublindf->oartifact == '\x1d') {
      pcVar8 = "Things that are here:";
    }
  }
  bVar1 = update_location(obj_cnt <= iflags.pilesize);
  mon = u.ustuck;
  if ((u.ustuck != (monst *)0x0 & u._1052_1_) == 1) {
    pcVar8 = mon_nam(u.ustuck);
    pcVar8 = s_suffix(pcVar8);
    pcVar4 = mbodypart(mon,0x12);
    sprintf(fbuf,"Contents of %s %s",pcVar8,pcVar4);
    if ((u.uprops[0x1e].intrinsic == 0) &&
       (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
        (((youmonst.data)->mflags1 & 0x1000) == 0)))) {
      pcVar8 = "look around";
    }
    else if (ublindf == (obj *)0x0) {
      pcVar8 = "try";
    }
    else {
      pcVar8 = "try";
      if (ublindf->oartifact == '\x1d') {
        pcVar8 = "look around";
      }
    }
    pline("You %s to %s what is lying in %s.",pcVar8,pcVar11,fbuf + 0xc);
    poVar10 = mon->minvent;
    if (poVar10 != (obj *)0x0) {
      bVar12 = false;
      do {
        if ((poVar10->otyp == 0x10e) && (bVar1 = will_feel_cockatrice(poVar10,'\0'), bVar1 != '\0'))
        break;
        poVar10 = poVar10->nobj;
        bVar12 = poVar10 == (obj *)0x0;
      } while (!bVar12);
      if ((!bVar12) && (u.uprops[0x21].intrinsic == 0)) {
        pcVar8 = doname_price(poVar10);
        pline("You %s here %s.",pcVar11,pcVar8);
        goto LAB_001b1857;
      }
      if (((u.uprops[0x1e].intrinsic != 0) ||
          (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
           (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
         ((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')))) {
        builtin_strncpy(fbuf,"You feel",9);
      }
      sVar6 = strlen(fbuf);
      (fbuf + sVar6)[0] = ':';
      (fbuf + sVar6)[1] = '\0';
      display_minventory(mon,2,fbuf);
      goto LAB_001b1ae6;
    }
  }
  else {
    if (((obj_cnt <= iVar9) && (ptVar5 = t_at(level,(int)u.ux,(int)u.uy), ptVar5 != (trap *)0x0)) &&
       ((ptVar5->field_0x8 & 0x20) != 0)) {
      pcVar4 = an(defexplain[(ulong)((byte)ptVar5->field_0x8 & 0x1f) + 0x2f]);
      pline("There is %s here.",pcVar4);
    }
    local_248 = level->objects[(int)u.ux][(int)u.uy];
    pcVar4 = dfeature_at((int)u.ux,(int)u.uy,fbuf2);
    if (pcVar4 == (char *)0x0) {
      pcVar4 = (char *)0x0;
    }
    else {
      iVar3 = strcmp(pcVar4,"pool of water");
      if ((iVar3 == 0) && ((u._1052_1_ & 2) != 0)) {
        pcVar4 = (char *)0x0;
      }
    }
    if (((u.uprops[0x1e].intrinsic != 0) ||
        (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
         (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
       ((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')))) {
      local_258 = pcVar8;
      local_240 = pcVar11;
      bVar2 = on_level(&u.uz,&dungeon_topology.d_air_level);
      bVar12 = true;
      if (bVar2 == '\0') {
        bVar2 = on_level(&u.uz,&dungeon_topology.d_water_level);
        bVar12 = bVar2 != '\0';
      }
      if ((pcVar4 == (char *)0x0) || (iVar3 = strncmp(pcVar4,"altar ",6), iVar3 != 0)) {
        pcVar11 = "floating here";
        if (bVar12) {
          pcVar8 = "";
        }
        else {
          pcVar11 = "lying here on the ";
          pcVar8 = surface((int)u.ux,(int)u.uy);
        }
        pline("You try to feel what is %s%s.",pcVar11,pcVar8);
      }
      else {
        pline("You try to feel what is here.");
      }
      pcVar11 = local_240;
      if (!bVar12 && pcVar4 != (char *)0x0) {
        pcVar8 = surface((int)u.ux,(int)u.uy);
        iVar3 = strcmp(pcVar4,pcVar8);
        if (iVar3 == 0) {
          pcVar4 = (char *)0x0;
        }
      }
      pcVar8 = local_258;
      bVar2 = can_reach_floor();
      if (bVar2 == '\0') {
        pline("But you can\'t reach it!");
        return 0;
      }
    }
    if (pcVar4 != (char *)0x0) {
      pcVar7 = an(pcVar4);
      sprintf(fbuf,"There is %s here.",pcVar7);
    }
    if (((local_248 != (obj *)0x0) && (bVar2 = is_lava(level,(int)u.ux,(int)u.uy), bVar2 == '\0'))
       && ((bVar2 = is_pool(level,(int)u.ux,(int)u.uy), poVar10 = local_248, bVar2 == '\0' ||
           ((u._1052_1_ & 2) != 0)))) {
      if (iVar9 < obj_cnt) {
        if (pcVar4 != (char *)0x0) {
          pline(fbuf);
        }
        read_engr_at((int)u.ux,(int)u.uy);
        pcVar11 = "many";
        if (obj_cnt < 0xb) {
          pcVar11 = "several";
        }
        pcVar8 = " more";
        if ((char)local_24c == '\0') {
          pcVar8 = "";
        }
        pline("There are %s%s objects here.",pcVar11,pcVar8);
      }
      else if ((local_248->v).v_nexthere == (obj *)0x0) {
        if (pcVar4 != (char *)0x0) {
          pline(fbuf);
        }
        read_engr_at((int)u.ux,(int)u.uy);
        pcVar8 = doname_price(poVar10);
        pline("You %s here %s.",pcVar11,pcVar8);
        if (((poVar10->otyp == 0x10e) && (bVar1 = will_feel_cockatrice(poVar10,'\0'), bVar1 != '\0')
            ) && (u.uprops[0x21].intrinsic == 0)) goto LAB_001b1857;
      }
      else {
        poVar10 = level->objects[u.ux][u.uy];
        local_258 = pcVar8;
        while ((poVar10 != (obj *)0x0 &&
               ((poVar10->otyp != 0x10e ||
                (bVar2 = will_feel_cockatrice(poVar10,'\0'), bVar2 == '\0'))))) {
          poVar10 = (poVar10->v).v_nexthere;
        }
        if ((poVar10 != (obj *)0x0) && (u.uprops[0x21].intrinsic == 0)) {
          pcVar8 = doname_price(poVar10);
          pline("You %s here %s.",pcVar11,pcVar8);
LAB_001b1857:
          feel_cockatrice(poVar10,'\0');
          return 1;
        }
        items = (nh_objitem *)malloc((long)size * 0x124);
        if (pcVar4 == (char *)0x0) {
          iVar9 = 0;
        }
        else {
          add_objitem(&items,&size,MI_TEXT,0,0,fbuf,(obj *)0x0,'\0');
          add_objitem(&items,&size,MI_TEXT,1,0,"",(obj *)0x0,'\0');
          iVar9 = 2;
        }
        poVar10 = level->objects[u.ux][u.uy];
        if (poVar10 != (obj *)0x0) {
          iVar3 = iVar9;
          do {
            iVar9 = iVar3 + 1;
            pcVar11 = doname(poVar10);
            add_objitem(&items,&size,MI_NORMAL,iVar3,0,pcVar11,poVar10,'\0');
            poVar10 = (poVar10->v).v_nexthere;
            iVar3 = iVar9;
          } while (poVar10 != (obj *)0x0);
        }
        if (obj_cnt == 0 || bVar1 == '\0') {
          display_objects(items,iVar9,local_258,0,(nh_objresult *)0x0);
        }
        free(items);
        read_engr_at((int)u.ux,(int)u.uy);
      }
      goto LAB_001b1ae6;
    }
    if (pcVar4 != (char *)0x0) {
      pline(fbuf);
    }
    read_engr_at((int)u.ux,(int)u.uy);
    if (iVar9 < obj_cnt) goto LAB_001b1ae6;
    if ((u.uprops[0x1e].intrinsic == 0) &&
       (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
        (((youmonst.data)->mflags1 & 0x1000) == 0)))) {
      if (pcVar4 != (char *)0x0) goto LAB_001b1ae6;
    }
    else if (((ublindf != (obj *)0x0) && (pcVar4 != (char *)0x0)) && (ublindf->oartifact == '\x1d'))
    goto LAB_001b1ae6;
  }
  pline("You %s no objects here.",pcVar11);
LAB_001b1ae6:
  if (((u.uprops[0x1e].intrinsic == 0) && ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)))) &&
     (((youmonst.data)->mflags1 & 0x1000) == 0)) {
    return 0;
  }
  if (ublindf == (obj *)0x0) {
    return 1;
  }
  return (uint)(ublindf->oartifact != '\x1d');
}

Assistant:

int look_here(int obj_cnt, /* obj_cnt > 0 implies that autopickup is in progess */
	      boolean picked_some)
{
	struct obj *otmp;
	struct trap *trap;
	const char *verb = Blind ? "feel" : "see";
	const char *dfeature = NULL;
	char fbuf[BUFSZ], fbuf2[BUFSZ];
	boolean skip_objects = (obj_cnt > iflags.pilesize);
	int icount = 0;
	int size = 10;
	struct nh_objitem *items = NULL;
	const char *title = Blind ? "Things that you feel here:" :
				    "Things that are here:";

	/* show the "things that are here" window iff
	 * - the player didn't get the info via update_location -OR-
	 * - it was explicitly requested (obj_cnt == 0) */
	boolean skip_win = update_location(!skip_objects) && obj_cnt;

	if (u.uswallow && u.ustuck) {
	    struct monst *mtmp = u.ustuck;
	    sprintf(fbuf, "Contents of %s %s",
		s_suffix(mon_nam(mtmp)), mbodypart(mtmp, STOMACH));
	    /* Skip "Contents of " by using fbuf index 12 */
	    pline("You %s to %s what is lying in %s.",
		Blind ? "try" : "look around", verb, &fbuf[12]);
	    otmp = mtmp->minvent;
	    if (otmp) {
		for ( ; otmp; otmp = otmp->nobj) {
		    /* If swallower is an animal, it should have become stone but... */
		    if (otmp->otyp == CORPSE && will_feel_cockatrice(otmp, FALSE))
			break;
		}
		if (otmp && !Stoned) {
		    pline("You %s here %s.", verb, doname_price(otmp));
		    feel_cockatrice(otmp, FALSE);
		    return 1;
		}
		if (Blind) strcpy(fbuf, "You feel");
		strcat(fbuf,":");
		display_minventory(mtmp, MINV_ALL, fbuf);
	    } else {
		pline("You %s no objects here.", verb);
	    }
	    return !!Blind;
	}
	if (!skip_objects && (trap = t_at(level, u.ux, u.uy)) && trap->tseen)
		pline("There is %s here.",
			an(trapexplain[trap->ttyp - 1]));

	otmp = level->objects[u.ux][u.uy];
	dfeature = dfeature_at(u.ux, u.uy, fbuf2);
	if (dfeature && !strcmp(dfeature, "pool of water") && Underwater)
		dfeature = NULL;

	if (Blind) {
		boolean drift = Is_airlevel(&u.uz) || Is_waterlevel(&u.uz);
		if (dfeature && !strncmp(dfeature, "altar ", 6)) {
		    /* don't say "altar" twice, dfeature has more info */
		    pline("You try to feel what is here.");
		} else {
		    pline("You try to feel what is %s%s.",
			drift ? "floating here" : "lying here on the ",
			drift ? ""		: surface(u.ux, u.uy));
		}
		if (dfeature && !drift && !strcmp(dfeature, surface(u.ux,u.uy)))
			dfeature = NULL;	/* ice already identifed */
		if (!can_reach_floor()) {
			pline("But you can't reach it!");
			return 0;
		}
	}

	if (dfeature)
		sprintf(fbuf, "There is %s here.", an(dfeature));

	if (!otmp || is_lava(level, u.ux, u.uy) || (is_pool(level, u.ux, u.uy) && !Underwater)) {
		if (dfeature) pline(fbuf);
		read_engr_at(u.ux, u.uy);
		if (!skip_objects && (Blind || !dfeature))
		    pline("You %s no objects here.", verb);
		return !!Blind;
	}
	/* we know there is something here */

	if (skip_objects) {
	    if (dfeature) pline(fbuf);
	    read_engr_at(u.ux, u.uy);
	    pline("There are %s%s objects here.",
		  (obj_cnt <= 10) ? "several" : "many",
		  picked_some ? " more" : "");

	} else if (!otmp->nexthere) {
	    /* only one object */
	    if (dfeature) pline(fbuf);
	    read_engr_at(u.ux, u.uy);
#ifdef INVISIBLE_OBJECTS
	    if (otmp->oinvis && !See_invisible) verb = "feel";
#endif
	    pline("You %s here %s.", verb, doname_price(otmp));
	    if (otmp->otyp == CORPSE && will_feel_cockatrice(otmp, FALSE) && !Stoned) {
		feel_cockatrice(otmp, FALSE);
		return 1;
	    }

	} else {
	    for (otmp = level->objects[u.ux][u.uy]; otmp; otmp = otmp->nexthere) {
		if (otmp->otyp == CORPSE && will_feel_cockatrice(otmp, FALSE))
		    break;
	    }
	    if (otmp && !Stoned) {
		pline("You %s here %s.", verb, doname_price(otmp));
		feel_cockatrice(otmp, FALSE);
		return 1;
	    }

	    items = malloc(size * sizeof(struct nh_objitem));
	    if (dfeature) {
		add_objitem(&items, &size, MI_TEXT, icount++, 0, fbuf, NULL, FALSE);
		add_objitem(&items, &size, MI_TEXT, icount++, 0, "", NULL, FALSE);
	    }

	    for (otmp = level->objects[u.ux][u.uy]; otmp; otmp = otmp->nexthere) {
		add_objitem(&items, &size, MI_NORMAL, icount++, 0,
			    doname(otmp), otmp, FALSE);
	    }

	    if (!skip_win)
		display_objects(items, icount, title, PICK_NONE, NULL);
	    free(items);

	    read_engr_at(u.ux, u.uy);
	}
	return !!Blind;
}